

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateVisitor.cpp
# Opt level: O0

Temporary * __thiscall
IRT::TemplateVisitor<IRT::Temporary>::Accept
          (Temporary *__return_storage_ptr__,TemplateVisitor<IRT::Temporary> *this,
          BaseElement *base_element)

{
  BaseElement *base_element_local;
  TemplateVisitor<IRT::Temporary> *this_local;
  
  (*base_element->_vptr_BaseElement[2])();
  Temporary::Temporary(__return_storage_ptr__,&this->tos_value_);
  return __return_storage_ptr__;
}

Assistant:

T TemplateVisitor<T>::Accept(BaseElement* base_element) {
  base_element->Accept(this);
  return tos_value_;
}